

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O0

MPP_RET hal_jpegd_vdpu2_deinit(void *hal)

{
  JpegdHalCtx *JpegHalCtx;
  MPP_RET ret;
  void *hal_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","hal_jpegd_vdpu2_deinit");
  }
  if (*(long *)((long)hal + 0x10) != 0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x10));
    *(undefined8 *)((long)hal + 0x10) = 0;
  }
  if ((*(long *)((long)hal + 0x28) == 0) ||
     (hal_local._4_4_ =
           mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x28),"hal_jpegd_vdpu2_deinit"),
     hal_local._4_4_ == MPP_OK)) {
    if ((*(long *)((long)hal + 0x20) == 0) ||
       (hal_local._4_4_ = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x20)),
       hal_local._4_4_ == MPP_OK)) {
      if (*(long *)((long)hal + 0x18) != 0) {
        mpp_osal_free("hal_jpegd_vdpu2_deinit",*(void **)((long)hal + 0x18));
        *(undefined8 *)((long)hal + 0x18) = 0;
      }
      *(undefined4 *)((long)hal + 0x94) = 0;
      *(undefined4 *)((long)hal + 0x98) = 0;
      *(undefined4 *)((long)hal + 0x9c) = 0;
      *(undefined4 *)((long)hal + 0xa0) = 0;
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","hal_jpegd_vdpu2_deinit");
      }
      hal_local._4_4_ = MPP_OK;
    }
    else {
      _mpp_log_l(2,"HAL_JPEG_VDPU2","group free buffer failed\n","hal_jpegd_vdpu2_deinit");
    }
  }
  else {
    _mpp_log_l(2,"HAL_JPEG_VDPU2","put table buffer failed\n","hal_jpegd_vdpu2_deinit");
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_jpegd_vdpu2_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;

    jpegd_dbg_func("enter\n");

    if (JpegHalCtx->dev) {
        mpp_dev_deinit(JpegHalCtx->dev);
        JpegHalCtx->dev = NULL;
    }

    if (JpegHalCtx->pTableBase) {
        ret = mpp_buffer_put(JpegHalCtx->pTableBase);
        if (ret) {
            mpp_err_f("put table buffer failed\n");
            return ret;
        }
    }

    if (JpegHalCtx->group) {
        ret = mpp_buffer_group_put(JpegHalCtx->group);
        if (ret) {
            mpp_err_f("group free buffer failed\n");
            return ret;
        }
    }

    if (JpegHalCtx->regs) {
        mpp_free(JpegHalCtx->regs);
        JpegHalCtx->regs = NULL;
    }

    JpegHalCtx->set_output_fmt_flag = 0;
    JpegHalCtx->hal_debug_enable = 0;
    JpegHalCtx->frame_count = 0;
    JpegHalCtx->output_yuv_count = 0;

    jpegd_dbg_func("exit\n");
    return MPP_OK;
}